

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

FT_Error FT_Stream_OpenGzip(FT_Stream stream,FT_Stream source)

{
  FT_Memory memory;
  FT_Error FVar1;
  int iVar2;
  FT_UInt32 FVar3;
  undefined8 in_RAX;
  FT_GZipFile zip;
  FT_Byte *buffer;
  FT_ULong FVar4;
  unsigned_long count;
  FT_Error error;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (stream == (FT_Stream)0x0 || source == (FT_Stream)0x0) {
    return 0x28;
  }
  memory = source->memory;
  error = ft_gzip_check_header(source);
  if (error != 0) {
    return error;
  }
  stream->close = (FT_Stream_CloseFunc)0x0;
  stream->memory = (FT_Memory)0x0;
  stream->cursor = (uchar *)0x0;
  stream->limit = (uchar *)0x0;
  (stream->pathname).value = 0;
  stream->read = (FT_Stream_IoFunc)0x0;
  stream->pos = 0;
  (stream->descriptor).value = 0;
  stream->base = (uchar *)0x0;
  stream->size = 0;
  stream->memory = memory;
  zip = (FT_GZipFile)ft_mem_qalloc(memory,0x20a8,&error);
  if (error == 0) {
    zip->stream = stream;
    zip->source = source;
    zip->memory = stream->memory;
    zip->limit = (FT_Byte *)&zip->pos;
    zip->cursor = (FT_Byte *)&zip->pos;
    zip->pos = 0;
    FVar1 = ft_gzip_check_header(source);
    if (FVar1 != 0) {
LAB_0022d798:
      error = FVar1;
      ft_mem_free(memory,zip);
      return error;
    }
    FVar4 = FT_Stream_Pos(source);
    zip->start = FVar4;
    (zip->zstream).zalloc = ft_gzip_alloc;
    (zip->zstream).zfree = ft_gzip_free;
    (zip->zstream).opaque = source->memory;
    (zip->zstream).avail_in = 0;
    (zip->zstream).next_in = zip->buffer;
    iVar2 = inflateInit2_(&zip->zstream,-0xf,"1.2.11",0x70);
    FVar1 = 3;
    if ((iVar2 != 0) || ((zip->zstream).next_in == (Bytef *)0x0)) goto LAB_0022d798;
    error = 0;
    (stream->descriptor).pointer = zip;
  }
  FVar4 = source->pos;
  FVar1 = FT_Stream_Seek(source,source->size - 4);
  if (FVar1 == 0) {
    FVar3 = FT_Stream_ReadULongLE(source,&local_34);
    count = 0;
    if (local_34 == 0) {
      count = (unsigned_long)FVar3;
    }
    FT_Stream_Seek(source,FVar4);
    if (count - 1 < 0x9fff) {
      buffer = (FT_Byte *)ft_mem_qalloc(memory,count,&error);
      if (error == 0) {
        FVar4 = ft_gzip_file_io(zip,0,buffer,count);
        if (FVar4 == count) {
          ft_gzip_file_done(zip);
          ft_mem_free(memory,zip);
          stream->size = count;
          stream->pos = 0;
          (stream->descriptor).value = 0;
          stream->base = buffer;
          stream->read = (FT_Stream_IoFunc)0x0;
          goto LAB_0022d6d3;
        }
        ft_gzip_file_io(zip,0,(FT_Byte *)0x0,0);
        ft_mem_free(memory,buffer);
      }
      error = 0;
    }
    else if (count == 0) goto LAB_0022d6b5;
  }
  else {
LAB_0022d6b5:
    count = 0x7fffffff;
  }
  stream->size = count;
  stream->pos = 0;
  stream->base = (uchar *)0x0;
  stream->read = ft_gzip_stream_io;
LAB_0022d6d3:
  stream->close = ft_gzip_stream_close;
  return error;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stream_OpenGzip( FT_Stream  stream,
                      FT_Stream  source )
  {
    FT_Error     error;
    FT_Memory    memory;
    FT_GZipFile  zip = NULL;


    if ( !stream || !source )
    {
      error = FT_THROW( Invalid_Stream_Handle );
      goto Exit;
    }

    memory = source->memory;

    /*
     * check the header right now; this prevents allocating un-necessary
     * objects when we don't need them
     */
    error = ft_gzip_check_header( source );
    if ( error )
      goto Exit;

    FT_ZERO( stream );
    stream->memory = memory;

    if ( !FT_QNEW( zip ) )
    {
      error = ft_gzip_file_init( zip, stream, source );
      if ( error )
      {
        FT_FREE( zip );
        goto Exit;
      }

      stream->descriptor.pointer = zip;
    }

    /*
     * We use the following trick to try to dramatically improve the
     * performance while dealing with small files.  If the original stream
     * size is less than a certain threshold, we try to load the whole font
     * file into memory.  This saves us from using the 32KB buffer needed
     * to inflate the file, plus the two 4KB intermediate input/output
     * buffers used in the `FT_GZipFile' structure.
     */
    {
      FT_ULong  zip_size = ft_gzip_get_uncompressed_size( source );


      if ( zip_size != 0 && zip_size < 40 * 1024 )
      {
        FT_Byte*  zip_buff = NULL;


        if ( !FT_QALLOC( zip_buff, zip_size ) )
        {
          FT_ULong  count;


          count = ft_gzip_file_io( zip, 0, zip_buff, zip_size );
          if ( count == zip_size )
          {
            ft_gzip_file_done( zip );
            FT_FREE( zip );

            stream->descriptor.pointer = NULL;

            stream->size  = zip_size;
            stream->pos   = 0;
            stream->base  = zip_buff;
            stream->read  = NULL;
            stream->close = ft_gzip_stream_close;

            goto Exit;
          }

          ft_gzip_file_io( zip, 0, NULL, 0 );
          FT_FREE( zip_buff );
        }
        error = FT_Err_Ok;
      }

      if ( zip_size )
        stream->size = zip_size;
      else
        stream->size  = 0x7FFFFFFFL;  /* don't know the real size! */
    }

    stream->pos   = 0;
    stream->base  = NULL;
    stream->read  = ft_gzip_stream_io;
    stream->close = ft_gzip_stream_close;

  Exit:
    return error;
  }